

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlRenderer::DebugRulePrecedence(GdlRenderer *this,GrcManager *pcman,ostream *strmOut)

{
  GdlRuleTable *pGVar1;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"linebreak",&local_a1);
  pGVar1 = FindRuleTable(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugRulePrecedence(pGVar1,pcman,strmOut,this->m_ipassBidi);
  }
  std::__cxx11::string::string((string *)&local_60,"substitution",&local_a1);
  pGVar1 = FindRuleTable(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugRulePrecedence(pGVar1,pcman,strmOut,this->m_ipassBidi);
  }
  std::__cxx11::string::string((string *)&local_80,"justification",&local_a1);
  pGVar1 = FindRuleTable(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugRulePrecedence(pGVar1,pcman,strmOut,this->m_ipassBidi);
  }
  std::__cxx11::string::string((string *)&local_a0,"positioning",&local_a1);
  pGVar1 = FindRuleTable(this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (pGVar1 != (GdlRuleTable *)0x0) {
    GdlRuleTable::DebugRulePrecedence(pGVar1,pcman,strmOut,this->m_ipassBidi);
  }
  return;
}

Assistant:

void GdlRenderer::DebugRulePrecedence(GrcManager * pcman, std::ostream & strmOut)
{
	GdlRuleTable * prultbl;

	if ((prultbl = FindRuleTable("linebreak")) != NULL)
		prultbl->DebugRulePrecedence(pcman, strmOut, m_ipassBidi);

	if ((prultbl = FindRuleTable("substitution")) != NULL)
		prultbl->DebugRulePrecedence(pcman, strmOut, m_ipassBidi);

	if ((prultbl = FindRuleTable("justification")) != NULL)
		prultbl->DebugRulePrecedence(pcman, strmOut, m_ipassBidi);

	if ((prultbl = FindRuleTable("positioning")) != NULL)
		prultbl->DebugRulePrecedence(pcman, strmOut, m_ipassBidi);
}